

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void voc_parse_dict_lookup(voccxdef *ctx)

{
  ushort uVar1;
  runcxdef *ctx_00;
  runsdef *prVar2;
  ushort *puVar3;
  objnum *list2;
  ushort **ppuVar4;
  vocwdef *pvVar5;
  char *wrd2;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int len2;
  uint uVar10;
  int len;
  long lVar11;
  int p;
  uint wrdsiz;
  uint typsiz;
  vocseadef search_ctx;
  uint local_b0;
  uint local_ac;
  ushort *local_a8;
  objnum *local_a0;
  int local_94;
  ushort *local_90;
  uchar *local_88;
  voccxdef *local_80;
  ulong local_78;
  char *local_70;
  ulong local_68;
  vocseadef local_60;
  
  ctx_00 = ctx->voccxrun;
  local_88 = ctx->voc_stk_cur;
  local_a0 = (objnum *)voc_stk_alo(ctx,400);
  list2 = (objnum *)voc_stk_alo(ctx,400);
  prVar2 = ctx_00->runcxsp;
  ctx_00->runcxsp = prVar2 + -1;
  if (prVar2[-1].runstyp == '\a') {
    local_b0 = *(ushort *)prVar2[-1].runsv.runsvstr - 2;
    local_a8 = (ushort *)((long)prVar2[-1].runsv.runsvstr + 2);
    ctx_00->runcxsp = prVar2 + -2;
    if (prVar2[-2].runstyp == '\a') {
      local_ac = *(ushort *)prVar2[-2].runsv.runsvstr - 2;
      local_90 = (ushort *)((long)prVar2[-2].runsv.runsvstr + 2);
      uVar8 = 0;
      local_80 = ctx;
      do {
        puVar3 = local_a8;
        if (local_b0 == 0) {
LAB_001f84af:
          voc_push_objlist(ctx,local_a0,(int)uVar8);
          ctx->voc_stk_cur = local_88;
          return;
        }
        if ((char)*local_a8 == '\x03') {
          local_70 = (char *)((long)local_a8 + 3);
          uVar1 = *(ushort *)((long)local_a8 + 1);
          local_78 = (ulong)uVar1;
          local_94 = uVar1 - 2;
          lVar11 = 0;
          local_68 = uVar8;
          while( true ) {
            len = (int)lVar11;
            if (uVar1 - 2 == len) break;
            lVar7 = (long)*(char *)((long)puVar3 + lVar11 + 3);
            if ((-1 < lVar7) &&
               (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + lVar7 * 2 + 1) & 0x20) != 0))
            {
              wrd2 = (char *)((long)puVar3 + lVar11 + 4);
              len2 = ((int)local_78 - len) + -3;
              goto LAB_001f838b;
            }
            lVar11 = lVar11 + 1;
          }
          wrd2 = (char *)0x0;
          len2 = 0;
          len = local_94;
LAB_001f838b:
          uVar8 = local_68;
          ctx = local_80;
          p = 0;
          if ((local_ac != 0) && (p = 0, (char)*local_90 == '\x01')) {
            for (lVar11 = 0; (int)lVar11 != 6; lVar11 = lVar11 + 1) {
              if ((voc_parse_dict_lookup::typemap[lVar11].flag & *(uint *)((long)local_90 + 1)) != 0
                 ) {
                p = voc_parse_dict_lookup::typemap[lVar11].prop;
                break;
              }
            }
          }
          pvVar5 = vocffw(local_80,local_70,len,wrd2,len2,p,&local_60);
          uVar10 = 0;
          while ((lVar11 = (long)(int)uVar10, pvVar5 != (vocwdef *)0x0 && ((int)uVar10 < 199))) {
            uVar6 = 0;
            if (0 < (int)uVar10) {
              uVar6 = (ulong)uVar10;
            }
            for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
              if (list2[uVar9] == pvVar5->vocwobj) {
                uVar6 = uVar9 & 0xffffffff;
                break;
              }
            }
            if ((uint)uVar6 == uVar10) {
              uVar10 = uVar10 + 1;
              list2[lVar11] = pvVar5->vocwobj;
            }
            pvVar5 = vocfnw(ctx,&local_60);
          }
          list2[lVar11] = 0xffff;
          if ((int)uVar8 == 0) {
            memcpy(local_a0,list2,lVar11 * 2 + 2);
          }
          else {
            uVar10 = vocisect(local_a0,list2);
          }
          uVar8 = (ulong)uVar10;
          if (uVar10 == 0) {
            uVar8 = 0;
            goto LAB_001f84af;
          }
        }
        lstadv((uchar **)&local_a8,&local_b0);
        if (local_ac != 0) {
          lstadv((uchar **)&local_90,&local_ac);
        }
      } while( true );
    }
  }
  ctx_00->runcxerr->errcxptr->erraac = 0;
  runsign(ctx_00,0x3fc);
}

Assistant:

void voc_parse_dict_lookup(voccxdef *ctx)
{
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    uchar *wrdp;
    uint wrdsiz;
    uchar *typp;
    uint typsiz;
    objnum *list1;
    objnum *list2;
    int cnt1;
    int cnt2;

    /* enter our stack frame and allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, objnum, list1);
    VOC_MAX_ARRAY(ctx, objnum, list2);
    
    /* get the word list, and read and skip its size prefix */
    wrdp = runpoplst(rcx);
    wrdsiz = osrp2(wrdp) - 2;
    wrdp += 2;

    /* get the type list, and read and skip its size prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* nothing in the main list yet */
    cnt1 = 0;

    /* go through the word list */
    while (wrdsiz > 0)
    {
        int curtyp;
        int type_prop;
        char *curword;
        uint curwordlen;
        char *curword2;
        uint curwordlen2;
        vocwdef *v;
        char *p;
        uint len;
        vocseadef  search_ctx;
        
        /* if this entry is a string, consider it */
        if (*wrdp == DAT_SSTRING)
        {
            /* get the current word's text string */
            curword = (char *)(wrdp + 3);
            curwordlen = osrp2(wrdp+1) - 2;

            /* check for an embedded space */
            for (p = curword, len = curwordlen ; len != 0 && !t_isspace(*p) ;
                 ++p, --len) ;
            if (len != 0)
            {
                /* get the second word */
                curword2 = p + 1;
                curwordlen2 = len - 1;

                /* truncate the first word accordingly */
                curwordlen -= len;
            }
            else
            {
                /* no embedded space -> no second word */
                curword2 = 0;
                curwordlen2 = 0;
            }

            /* presume we won't find a valid type property */
            type_prop = PRP_INVALID;

            /* 
             *   get this type entry, if there's another entry in the
             *   list, and it's of the appropriate type 
             */
            if (typsiz > 0 && *typp == DAT_NUMBER)
            {
                /*
                 *   Figure out what type property we'll be using.  We'll
                 *   consider only one meaning for each word, and we'll
                 *   arbitrarily pick one if the type code has more than
                 *   one type, because we expect the caller to provide
                 *   exactly one type per word.  
                 */
                int i;
                struct typemap_t
                {
                    int flag;
                    int prop;
                };
                static struct typemap_t typemap[] =
                {
                    { VOCT_ARTICLE, PRP_ARTICLE },
                    { VOCT_ADJ,     PRP_ADJ },
                    { VOCT_NOUN,    PRP_NOUN },
                    { VOCT_PREP,    PRP_PREP },
                    { VOCT_VERB,    PRP_VERB },
                    { VOCT_PLURAL,  PRP_PLURAL }
                };
                struct typemap_t *mapp;

                /* get the type */
                curtyp = (int)osrp4(typp+1);

                /* search for a type */
                for (mapp = typemap, i = sizeof(typemap)/sizeof(typemap[0]) ;
                     i != 0 ; ++mapp, --i)
                {
                    /* if this flag is set, use this type property */
                    if ((curtyp & mapp->flag) != 0)
                    {
                        /* use this one */
                        type_prop = mapp->prop;
                        break;
                    }
                }
            }

            /* nothing in the new list yet */
            cnt2 = 0;

            /* scan for matching words */
            for (v = vocffw(ctx, curword, curwordlen, curword2, curwordlen2,
                            type_prop, &search_ctx) ;
                 v != 0 ;
                 v = vocfnw(ctx, &search_ctx))
            {
                int i;
                
                /* make sure we have room in our list */
                if (cnt2 >= VOCMAXAMBIG - 1)
                    break;

                /* make sure that this entry isn't already in our list */
                for (i = 0 ; i < cnt2 ; ++i)
                {
                    /* if this entry matches, stop looking */
                    if (list2[i] == v->vocwobj)
                        break;
                }

                /* if it's not already in the list, add it now */
                if (i == cnt2)
                {
                    /* add it to our list */
                    list2[cnt2++] = v->vocwobj;
                }
            }

            /* terminate the list */
            list2[cnt2] = MCMONINV;

            /* 
             *   if there's nothing in the first list, simply copy this
             *   into the first list; otherwise, intersect the two lists 
             */
            if (cnt1 == 0)
            {
                /* this is the first list -> copy it into the main list */
                memcpy(list1, list2, (cnt2+1)*sizeof(list2[0]));
                cnt1 = cnt2;
            }
            else
            {
                /* intersect the two lists */
                cnt1 = vocisect(list1, list2);
            }

            /* 
             *   if there's nothing in the result list now, there's no
             *   need to look any further, because further intersection
             *   will yield nothing 
             */
            if (cnt1 == 0)
                break;
        }
        
        /* advance the word list */
        lstadv(&wrdp, &wrdsiz);

        /* if there's anything left in the type list, advance it as well */
        if (typsiz > 0)
            lstadv(&typp, &typsiz);
    }

    /* push the result list */
    voc_push_objlist(ctx, list1, cnt1);

    /* exit our stack frame */
    voc_leave(ctx, save_sp);
}